

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdapStrategy.cpp
# Opt level: O0

optional<Vault::AuthenticationResponse> * __thiscall
Vault::LdapStrategy::authenticate
          (optional<Vault::AuthenticationResponse> *__return_storage_ptr__,LdapStrategy *this,
          Client *client)

{
  anon_class_8_1_8991fb9c local_98;
  NoArgJsonProducer local_90;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  Url local_40;
  Client *local_20;
  Client *client_local;
  LdapStrategy *this_local;
  
  local_20 = client;
  client_local = (Client *)this;
  this_local = (LdapStrategy *)__return_storage_ptr__;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_60,&this->username_);
  getUrl(&local_40,client,&local_60);
  local_98.this = this;
  std::function<std::__cxx11::string()>::
  function<Vault::LdapStrategy::authenticate(Vault::Client_const&)::__0,void>
            ((function<std::__cxx11::string()> *)&local_90,&local_98);
  HttpConsumer::authenticate(__return_storage_ptr__,client,&local_40,&local_90);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::~function(&local_90);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_40);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::AuthenticationResponse>
Vault::LdapStrategy::authenticate(const Vault::Client &client) {
  return Vault::HttpConsumer::authenticate(
      client, getUrl(client, Vault::Path{username_}), [&]() {
        nlohmann::json j;
        j = nlohmann::json::object();
        j["password"] = password_;
        return j.dump();
      });
}